

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

bool newReptContext(int32_t reptLineNo,char *body,size_t size)

{
  uint32_t uVar1;
  FileStackNode *fileInfo_00;
  int *piVar2;
  char *pcVar3;
  LexerState *pLVar4;
  uint local_34;
  FileStackReptNode *fileInfo;
  uint32_t reptDepth;
  size_t size_local;
  char *body_local;
  int32_t reptLineNo_local;
  
  if (contextStack->fileInfo->type == NODE_REPT) {
    local_34 = *(uint *)&contextStack->fileInfo[1].parent;
  }
  else {
    local_34 = 0;
  }
  fileInfo_00 = (FileStackNode *)malloc((ulong)(local_34 + 1) * 4 + 0x30);
  if (fileInfo_00 == (FileStackNode *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    error("Failed to alloc file info for REPT: %s\n",pcVar3);
    body_local._7_1_ = false;
  }
  else {
    fileInfo_00->type = NODE_REPT;
    *(uint *)&fileInfo_00[1].parent = local_34 + 1;
    *(undefined4 *)((long)&fileInfo_00[1].parent + 4) = 1;
    if (local_34 != 0) {
      memcpy(&fileInfo_00[1].lineNo,(void *)((long)&contextStack->fileInfo[1].parent + 4),
             (ulong)local_34 << 2);
    }
    newContext(fileInfo_00);
    contextStack->fileInfo->lineNo = reptLineNo;
    pLVar4 = lexer_OpenFileView("REPT",body,size,reptLineNo);
    contextStack->lexerState = pLVar4;
    if (contextStack->lexerState == (LexerState *)0x0) {
      fatalerror("Failed to set up lexer for REPT block\n");
    }
    lexer_SetStateAtEOL(contextStack->lexerState);
    uVar1 = macro_UseNewUniqueID();
    contextStack->uniqueID = uVar1;
    body_local._7_1_ = true;
  }
  return body_local._7_1_;
}

Assistant:

static bool newReptContext(int32_t reptLineNo, char *body, size_t size)
{
	uint32_t reptDepth = contextStack->fileInfo->type == NODE_REPT
				? ((struct FileStackReptNode *)contextStack->fileInfo)->reptDepth
				: 0;
	struct FileStackReptNode *fileInfo = (struct FileStackReptNode *)malloc(sizeof(*fileInfo)
			+ (reptDepth + 1) * sizeof(fileInfo->iters[0]));

	if (!fileInfo) {
		error("Failed to alloc file info for REPT: %s\n", strerror(errno));
		return false;
	}
	fileInfo->node.type = NODE_REPT;
	fileInfo->reptDepth = reptDepth + 1;
	fileInfo->iters[0] = 1;
	if (reptDepth)
		// Copy all parent iter counts
		memcpy(&fileInfo->iters[1],
		       ((struct FileStackReptNode *)contextStack->fileInfo)->iters,
		       reptDepth * sizeof(fileInfo->iters[0]));

	newContext((struct FileStackNode *)fileInfo);
	// Correct our line number, which currently points to the `ENDR` line
	contextStack->fileInfo->lineNo = reptLineNo;

	contextStack->lexerState = lexer_OpenFileView("REPT", body, size, reptLineNo);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for REPT block\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	contextStack->uniqueID = macro_UseNewUniqueID();
	return true;
}